

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O0

void __thiscall
GMAA_MAA_ELSI::Fill_joI_Array
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  value_type vVar1;
  ulong uVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  reference ppOVar6;
  ObservationHistory *pOVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  int in_ESI;
  long *in_RDI;
  long in_R8;
  Index agentI_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivObservationsTI;
  int tI;
  ObservationHistory *oh;
  ObservationHistoryTree *oht;
  Index agentI;
  vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> indOH;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  Index in_stack_fffffffffffffef4;
  value_type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  Index in_stack_ffffffffffffff04;
  Index in_stack_ffffffffffffff30;
  uint agentI_00;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff40;
  uint local_a4;
  int local_84;
  uint local_5c;
  vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  long local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  int local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff38);
  std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>::vector
            ((vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> *)
             0x9808fd);
  local_5c = 0;
  while( true ) {
    uVar5 = (ulong)local_5c;
    uVar2 = (**(code **)(*in_RDI + 0x30))();
    local_84 = local_c;
    if (uVar2 <= uVar5) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_20,(ulong)local_5c);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_40,(ulong)local_5c);
    *pvVar4 = *pvVar4 + vVar1;
    agentI_00 = local_5c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_40,(ulong)local_5c);
    in_stack_ffffffffffffff38 =
         (PlanningUnitMADPDiscrete *)
         PlanningUnitMADPDiscrete::GetObservationHistoryTree
                   (in_stack_ffffffffffffff38,agentI_00,in_stack_ffffffffffffff30);
    ObservationHistoryTree::GetObservationHistory((ObservationHistoryTree *)0x9809c5);
    std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>::push_back
              ((vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    local_5c = local_5c + 1;
  }
  while (local_84 = local_84 + -1, -1 < local_84) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x980a4a);
    for (local_a4 = 0; uVar5 = (**(code **)(*in_RDI + 0x30))(), local_a4 < uVar5;
        local_a4 = local_a4 + 1) {
      ppOVar6 = std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>
                ::operator[](&local_58,(ulong)local_a4);
      in_stack_ffffffffffffff04 = ObservationHistory::GetLastObservationIndex(*ppOVar6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type_conflict1 *)in_stack_fffffffffffffee8);
      ppOVar6 = std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>
                ::operator[](&local_58,(ulong)local_a4);
      pOVar7 = ObservationHistory::GetPredecessor(*ppOVar6);
      ppOVar6 = std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>
                ::operator[](&local_58,(ulong)local_a4);
      *ppOVar6 = pOVar7;
    }
    in_stack_fffffffffffffef4 =
         PlanningUnitMADPDiscrete::IndividualToJointObservationIndices
                   ((PlanningUnitMADPDiscrete *)
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffee8);
    *(Index *)(local_28 + (long)local_84 * 4) = in_stack_fffffffffffffef4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>::~vector
            ((vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return;
}

Assistant:

void GMAA_MAA_ELSI::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    vector<const ObservationHistory*> indOH;
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        const ObservationHistoryTree* oht = 
            GetObservationHistoryTree(agentI, indOHI[agentI]);
        const ObservationHistory* oh = oht->GetObservationHistory();
        indOH.push_back(oh);
    }
    //convert the vector of  ind. observation history indices to a array of
    //joint observations
    for(int tI=ts-1; tI >= 0; tI--)
    {
        vector<Index> indivObservationsTI;
        for(Index agentI=0; agentI < GetNrAgents(); agentI++)
        {
            indivObservationsTI.push_back( indOH[agentI]->
                    GetLastObservationIndex() );
            indOH[agentI] =  indOH[agentI]->GetPredecessor();
        }
        joI_arr[tI] = IndividualToJointObservationIndices(
                indivObservationsTI);
    }
}